

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O3

int xar_write_header(archive_write *a,archive_entry *entry)

{
  char cVar1;
  size_t sVar2;
  void *pvVar3;
  file *pfVar4;
  archive_entry *entry_00;
  archive_string *as;
  int iVar5;
  int iVar6;
  uint uVar7;
  mode_t mVar8;
  mode_t mVar9;
  archive_string_conv *paVar10;
  file *file;
  file *pfVar11;
  char *pcVar12;
  __off_t _Var13;
  uint64_t uVar14;
  la_int64_t lVar15;
  archive_digest *paVar16;
  int *piVar17;
  uint uVar18;
  long lVar19;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *fn;
  char *pathname;
  char *fn_00;
  archive_rb_tree *rbt;
  ulong uVar20;
  char *pcVar21;
  char name [256];
  archive_string local_168;
  archive_entry **local_150;
  archive_entry *local_148;
  archive_string *local_140;
  char local_138 [264];
  
  piVar17 = (int *)a->format_data;
  piVar17[0x10] = 0;
  piVar17[0x11] = 0;
  piVar17[0x12] = 0;
  piVar17[0x13] = 0;
  if (*(long *)(piVar17 + 0x46) == 0) {
    paVar10 = archive_string_conversion_to_charset(&a->archive,"UTF-8",L'\x01');
    *(archive_string_conv **)(piVar17 + 0x46) = paVar10;
    if (paVar10 == (archive_string_conv *)0x0) {
      return -0x1e;
    }
  }
  file = file_new(a,entry);
  if (file == (file *)0x0) {
    pcVar12 = "Can\'t allocate data";
    iVar5 = 0xc;
    goto LAB_0015ccbc;
  }
  iVar5 = file_gen_utility_names(a,file);
  if (iVar5 < -0x14) {
    return iVar5;
  }
  sVar2 = (file->parentdir).length;
  if (sVar2 == 0) {
    if ((file->basename).length == 0) {
      file_free(file);
      return iVar5;
    }
    local_148 = file->entry;
    pcVar12 = "";
  }
  else {
    local_148 = file->entry;
    pcVar12 = (file->parentdir).s;
  }
  local_150 = &file->entry;
  pvVar3 = a->format_data;
  pfVar4 = *(file **)((long)pvVar3 + 0x18);
  pcVar21 = extraout_RDX;
  if ((*(size_t *)((long)pvVar3 + 0x30) == sVar2) &&
     (iVar6 = strcmp(((archive_string *)((long)pvVar3 + 0x28))->s,pcVar12),
     pcVar21 = extraout_RDX_00, iVar6 == 0)) {
    pfVar4 = *(file **)((long)pvVar3 + 0x20);
    iVar6 = __archive_rb_tree_insert_node(&pfVar4->rbtree,&file->rbnode);
    if (iVar6 == 0) {
      rbt = (archive_rb_tree *)(*(long *)((long)pvVar3 + 0x20) + 0x28);
      pcVar12 = (file->basename).s;
LAB_0015d0fc:
      pfVar11 = (file *)__archive_rb_tree_find_node(rbt,pcVar12);
LAB_0015d104:
      mVar9 = archive_entry_filetype(pfVar11->entry);
      mVar8 = archive_entry_filetype(*local_150);
      entry_00 = pfVar11->entry;
      if (mVar9 != mVar8) {
        pcVar12 = archive_entry_pathname(entry_00);
        archive_set_error(&a->archive,-1,
                          "Found duplicate entries `%s\' and its file type is different",pcVar12);
LAB_0015d232:
        file_free(file);
        return -0x19;
      }
      pfVar11->entry = file->entry;
      file->entry = entry_00;
      pfVar11->field_0x168 = pfVar11->field_0x168 & 0xfe;
      file_free(file);
      file = pfVar11;
    }
    else {
      file->chnext = (file *)0x0;
      *(pfVar4->children).last = file;
      (pfVar4->children).last = &file->chnext;
      file->parent = pfVar4;
    }
  }
  else {
    local_140 = (archive_string *)((long)pvVar3 + 0x28);
    uVar7 = get_path_component(local_138,(int)pcVar12,pcVar21);
    uVar20 = 0;
    pcVar21 = pcVar12;
    while (uVar7 != 0) {
      if ((int)uVar7 < 0) goto LAB_0015d0c6;
      pfVar11 = (file *)__archive_rb_tree_find_node(&pfVar4->rbtree,local_138);
      if (pfVar11 == (file *)0x0) {
        uVar20 = (ulong)uVar7;
        break;
      }
      if (*pcVar21 == '\0') goto LAB_0015d104;
      if ((pfVar11->field_0x168 & 2) == 0) {
        pcVar12 = archive_entry_pathname(pfVar11->entry);
        pcVar21 = archive_entry_pathname(file->entry);
        archive_set_error(&a->archive,-1,"`%s\' is not directory, we cannot insert `%s\' ",pcVar12,
                          pcVar21);
        goto LAB_0015d232;
      }
      pcVar21 = pcVar21 + (ulong)(pcVar21[uVar7] == '/') + (ulong)uVar7;
      uVar7 = get_path_component(local_138,(int)pcVar21,fn);
      pfVar4 = pfVar11;
    }
    cVar1 = *pcVar21;
    as = local_140;
    while (local_140 = as, cVar1 != '\0') {
      local_168.s = (char *)0x0;
      local_168.length = 0;
      local_168.buffer_length = 0;
      archive_strncat(&local_168,pcVar12,(size_t)(pcVar21 + (uVar20 - (long)pcVar12)));
      if (*(char *)((long)local_168.s + (local_168.length - 1)) == '/') {
        *(undefined1 *)((long)local_168.s + (local_168.length - 1)) = 0;
        local_168.length = local_168.length - 1;
      }
      pfVar11 = file_create_virtual_dir(a,(xar_conflict *)local_168.s,pathname);
      archive_string_free(&local_168);
      if (pfVar11 == (file *)0x0) {
        pcVar12 = "Can\'t allocate memory";
        iVar5 = 0xc;
        goto LAB_0015d0d7;
      }
      iVar6 = file_gen_utility_names(a,pfVar11);
      if (iVar6 < -0x18) {
        return -0x1e;
      }
      iVar6 = __archive_rb_tree_insert_node(&pfVar4->rbtree,&pfVar11->rbnode);
      if (iVar6 != 0) {
        pfVar11->chnext = (file *)0x0;
        *(pfVar4->children).last = pfVar11;
        (pfVar4->children).last = &pfVar11->chnext;
        pfVar11->parent = pfVar4;
      }
      iVar6 = *(int *)((long)pvVar3 + 0x10);
      *(int *)((long)pvVar3 + 0x10) = iVar6 + 1;
      pfVar11->id = iVar6;
      pfVar11->next = (file *)0x0;
      **(undefined8 **)((long)pvVar3 + 0x101b0) = pfVar11;
      *(file ***)((long)pvVar3 + 0x101b0) = &pfVar11->next;
      pcVar21 = pcVar21 + (pcVar21[uVar20] == '/') + uVar20;
      uVar7 = get_path_component(local_138,(int)pcVar21,fn_00);
      if ((int)uVar7 < 0) {
        archive_string_free(&local_168);
LAB_0015d0c6:
        pcVar12 = "A name buffer is too small";
        iVar5 = -1;
LAB_0015d0d7:
        archive_set_error(&a->archive,iVar5,pcVar12);
        file_free(file);
        return -0x1e;
      }
      uVar20 = (ulong)uVar7;
      as = local_140;
      pfVar4 = pfVar11;
      cVar1 = *pcVar21;
    }
    *(file **)((long)pvVar3 + 0x20) = pfVar4;
    *(undefined8 *)((long)pvVar3 + 0x30) = 0;
    archive_string_ensure(as,(pfVar4->parentdir).length + (pfVar4->basename).length + 2);
    sVar2 = (pfVar4->parentdir).length;
    if ((pfVar4->basename).length + sVar2 == 0) {
      *as->s = '\0';
    }
    else {
      if (sVar2 != 0) {
        *(undefined8 *)((long)pvVar3 + 0x30) = 0;
        archive_string_concat(as,&pfVar4->parentdir);
        archive_strappend_char(as,'/');
      }
      archive_string_concat(as,&pfVar4->basename);
    }
    rbt = &pfVar4->rbtree;
    iVar6 = __archive_rb_tree_insert_node(rbt,&file->rbnode);
    if (iVar6 == 0) {
      pcVar12 = (file->basename).s;
      goto LAB_0015d0fc;
    }
    file->chnext = (file *)0x0;
    *(pfVar4->children).last = file;
    (pfVar4->children).last = &file->chnext;
    file->parent = pfVar4;
  }
  if (file->entry != local_148) {
    return iVar5;
  }
  if (file->id == 0) {
    iVar6 = piVar17[4];
    piVar17[4] = iVar6 + 1;
    file->id = iVar6;
    file->next = (file *)0x0;
    **(undefined8 **)(piVar17 + 0x406c) = file;
    *(file ***)(piVar17 + 0x406c) = &file->next;
  }
  if ((file->field_0x168 & 1) != 0) {
    return iVar5;
  }
  if (*piVar17 == -1) {
    piVar17[2] = 0;
    piVar17[3] = 0;
    iVar6 = __archive_mktemp((char *)0x0);
    *piVar17 = iVar6;
    if (iVar6 < 0) {
      piVar17 = __errno_location();
      iVar5 = *piVar17;
      pcVar12 = "Couldn\'t create temporary file";
LAB_0015ccbc:
      archive_set_error(&a->archive,iVar5,pcVar12);
      return -0x1e;
    }
    uVar7 = 0;
    if (piVar17[0x20] == 1) {
      uVar7 = 0x14;
    }
    uVar18 = 0x10;
    if (piVar17[0x20] != 2) {
      uVar18 = uVar7;
    }
    if (uVar18 != 0) {
      _Var13 = lseek(iVar6,(ulong)uVar18,0);
      if (_Var13 < 0) {
        piVar17 = __errno_location();
        iVar5 = *piVar17;
        pcVar12 = "lseek failed";
        goto LAB_0015ccbc;
      }
      *(ulong *)(piVar17 + 2) = (ulong)uVar18;
    }
  }
  pcVar12 = archive_entry_hardlink(file->entry);
  if ((pcVar12 == (char *)0x0) && (iVar6 = save_xattrs(a,file), iVar6 != 0)) {
    return -0x1e;
  }
  mVar9 = archive_entry_filetype(file->entry);
  if (mVar9 != 0x8000) {
    return iVar5;
  }
  *(file **)(piVar17 + 0x10) = file;
  uVar7 = archive_entry_nlink(file->entry);
  if (1 < uVar7) {
    iVar6 = file_register_hardlink(a,file);
    if (iVar6 != 0) {
      return iVar6;
    }
    pcVar12 = archive_entry_hardlink(file->entry);
    if (pcVar12 != (char *)0x0) {
      archive_entry_unset_size(file->entry);
      return iVar5;
    }
  }
  (file->data).temp_offset = *(uint64_t *)(piVar17 + 2);
  uVar14 = archive_entry_size(file->entry);
  (file->data).size = uVar14;
  (file->data).compression = piVar17[0x22];
  lVar15 = archive_entry_size(file->entry);
  *(la_int64_t *)(piVar17 + 0x12) = lVar15;
  iVar6 = piVar17[0x21];
  piVar17[0x26] = iVar6;
  paVar16 = &__archive_digest;
  if (iVar6 == 1) {
    paVar16 = (archive_digest *)&__archive_digest.sha1init;
    lVar19 = 0x10;
LAB_0015d340:
    (*paVar16->md5init)((archive_sha1_ctx *)((long)piVar17 + lVar19 + 0x98));
    iVar6 = piVar17[0x21];
  }
  else if (iVar6 == 2) {
    lVar19 = 8;
    goto LAB_0015d340;
  }
  piVar17[0x2c] = iVar6;
  paVar16 = &__archive_digest;
  if (iVar6 == 1) {
    paVar16 = (archive_digest *)&__archive_digest.sha1init;
    lVar19 = 0x10;
  }
  else {
    if (iVar6 != 2) goto LAB_0015d38a;
    lVar19 = 8;
  }
  (*paVar16->md5init)((archive_sha1_ctx *)((long)piVar17 + lVar19 + 0xb0));
LAB_0015d38a:
  iVar6 = xar_compression_init_encoder(a);
  if (iVar6 != 0) {
    iVar5 = iVar6;
  }
  return iVar5;
}

Assistant:

static int
xar_write_header(struct archive_write *a, struct archive_entry *entry)
{
	struct xar *xar;
	struct file *file;
	struct archive_entry *file_entry;
	int r, r2;

	xar = (struct xar *)a->format_data;
	xar->cur_file = NULL;
	xar->bytes_remaining = 0;

	if (xar->sconv == NULL) {
		xar->sconv = archive_string_conversion_to_charset(
		    &a->archive, "UTF-8", 1);
		if (xar->sconv == NULL)
			return (ARCHIVE_FATAL);
	}

	file = file_new(a, entry);
	if (file == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate data");
		return (ARCHIVE_FATAL);
	}
	r2 = file_gen_utility_names(a, file);
	if (r2 < ARCHIVE_WARN)
		return (r2);

	/*
	 * Ignore a path which looks like the top of directory name
	 * since we have already made the root directory of an Xar archive.
	 */
	if (archive_strlen(&(file->parentdir)) == 0 &&
	    archive_strlen(&(file->basename)) == 0) {
		file_free(file);
		return (r2);
	}

	/* Add entry into tree */
	file_entry = file->entry;
	r = file_tree(a, &file);
	if (r != ARCHIVE_OK)
		return (r);
	/* There is the same file in tree and
	 * the current file is older than the file in tree.
	 * So we don't need the current file data anymore. */
	if (file->entry != file_entry)
		return (r2);
	if (file->id == 0)
		file_register(xar, file);

	/* A virtual file, which is a directory, does not have
	 * any contents and we won't store it into a archive
	 * file other than its name. */
	if (file->virtual)
		return (r2);

	/*
	 * Prepare to save the contents of the file.
	 */
	if (xar->temp_fd == -1) {
		int algsize;
		xar->temp_offset = 0;
		xar->temp_fd = __archive_mktemp(NULL);
		if (xar->temp_fd < 0) {
			archive_set_error(&a->archive, errno,
			    "Couldn't create temporary file");
			return (ARCHIVE_FATAL);
		}
		algsize = getalgsize(xar->opt_toc_sumalg);
		if (algsize > 0) {
			if (lseek(xar->temp_fd, algsize, SEEK_SET) < 0) {
				archive_set_error(&(a->archive), errno,
				    "lseek failed");
				return (ARCHIVE_FATAL);
			}
			xar->temp_offset = algsize;
		}
	}

	if (archive_entry_hardlink(file->entry) == NULL) {
		r = save_xattrs(a, file);
		if (r != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	}

	/* Non regular files contents are unneeded to be saved to
	 * a temporary file. */
	if (archive_entry_filetype(file->entry) != AE_IFREG)
		return (r2);

	/*
	 * Set the current file to cur_file to read its contents.
	 */
	xar->cur_file = file;

	if (archive_entry_nlink(file->entry) > 1) {
		r = file_register_hardlink(a, file);
		if (r != ARCHIVE_OK)
			return (r);
		if (archive_entry_hardlink(file->entry) != NULL) {
			archive_entry_unset_size(file->entry);
			return (r2);
		}
	}

	/* Save a offset of current file in temporary file. */
	file->data.temp_offset = xar->temp_offset;
	file->data.size = archive_entry_size(file->entry);
	file->data.compression = xar->opt_compression;
	xar->bytes_remaining = archive_entry_size(file->entry);
	checksum_init(&(xar->a_sumwrk), xar->opt_sumalg);
	checksum_init(&(xar->e_sumwrk), xar->opt_sumalg);
	r = xar_compression_init_encoder(a);

	if (r != ARCHIVE_OK)
		return (r);
	else
		return (r2);
}